

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::ParseOneMapEntry
                 (NodeBase *node,char *ptr,ParseContext *ctx,FieldAux *aux,TcParseTableBase *table,
                 FieldEntry *entry,UntypedMapBase *map)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  MapTypeCard MVar4;
  MapTypeCard MVar5;
  ushort uVar6;
  undefined4 uVar7;
  LazyEagerVerifyFnType p_Var8;
  undefined1 auVar9 [12];
  bool bVar10;
  int iVar11;
  ulong uVar12;
  Nonnull<const_char_*> pcVar13;
  ushort *puVar14;
  ulong uVar15;
  uint uVar16;
  pointer pcVar17;
  ulong uVar18;
  pointer pcVar19;
  int iVar20;
  uint uVar21;
  string *s;
  uint uVar22;
  string_view message_name;
  pair<const_char_*,_int> pVar23;
  string_view sVar24;
  pair<const_char_*,_unsigned_int> pVar25;
  string_view field_name;
  undefined1 in_stack_ffffffffffffff68;
  MapTypeCard local_8a;
  ushort *local_88;
  byte local_7e;
  byte local_7d;
  uint local_7c;
  ushort *local_78;
  TcParseTableBase *in_stack_ffffffffffffff90;
  uchar local_64;
  int local_60;
  
  MVar4 = (aux->map_info).key_type_card;
  MVar5 = (aux->map_info).value_type_card;
  local_7e = (byte)(aux->enum_range).last;
  uVar21 = (ushort)MVar4 & 0xff;
  local_7c = (ushort)MVar5 & 0xff;
  local_7d = (local_7e >> 3 | local_7e >> 2) & 1;
  local_88 = (ushort *)ptr;
  do {
    bVar10 = EpsCopyInputStream::DoneWithCheck<false>
                       (&ctx->super_EpsCopyInputStream,(char **)&local_88,ctx->group_depth_);
    if (bVar10) {
      return (char *)local_88;
    }
    bVar2 = (byte)*local_88;
    uVar22 = (uint)(char)bVar2;
    if (uVar22 != local_7c && uVar22 != uVar21) {
      uVar22 = (uint)bVar2;
      puVar14 = (ushort *)((long)local_88 + 1);
      if ((char)bVar2 < '\0') {
        uVar22 = (uVar22 + (uint)*(byte *)puVar14 * 0x80) - 0x80;
        if ((char)*(byte *)puVar14 < '\0') {
          pVar25 = ReadTagFallback((char *)local_88,uVar22);
          puVar14 = (ushort *)pVar25.first;
          uVar22 = pVar25.second;
        }
        else {
          puVar14 = local_88 + 1;
        }
      }
      local_88 = puVar14;
      if (uVar22 == local_7c || uVar22 == uVar21) goto LAB_0044d488;
      if (puVar14 != (ushort *)0x0) {
        if (uVar22 == 0 || (uVar22 & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar22 - 1;
          iVar20 = 3;
        }
        else {
          puVar14 = (ushort *)UnknownFieldParse(uVar22,(string *)0x0,(char *)puVar14,ctx);
LAB_0044d804:
          iVar20 = 2 - (uint)(puVar14 == (ushort *)0x0);
          local_88 = puVar14;
        }
        goto LAB_0044d814;
      }
LAB_0044d90c:
      iVar20 = 1;
      goto LAB_0044d814;
    }
    local_88 = (ushort *)((long)local_88 + 1);
LAB_0044d488:
    if (uVar22 == uVar21) {
      uVar12 = (ulong)(byte)(map->type_info_).field_0x3 & 0xffffffffffffff0f;
      s = (string *)(node + 1);
      local_8a = MVar4;
    }
    else {
      uVar12 = (ulong)((uint)map->type_info_ >> 0x1c);
      s = (string *)((long)&node->next + (ulong)(map->type_info_).value_offset);
      local_8a = MVar5;
    }
    switch(uVar22 & 7) {
    case 0:
      pcVar19 = (pointer)(long)(char)(byte)*local_88;
      if ((long)pcVar19 < 0) {
        uVar15 = (long)(char)*(byte *)((long)local_88 + 1) << 7 | 0x7f;
        if ((long)uVar15 < 0) {
          uVar18 = (long)(char)(byte)local_88[1] << 0xe | 0x3fff;
          if ((long)uVar18 < 0) {
            uVar15 = uVar15 & ((long)(char)*(byte *)((long)local_88 + 3) << 0x15 | 0x1fffffU);
            if ((long)uVar15 < 0) {
              uVar18 = uVar18 & ((long)(char)(byte)local_88[2] << 0x1c | 0xfffffffU);
              if ((long)uVar18 < 0) {
                uVar15 = uVar15 & ((long)(char)*(byte *)((long)local_88 + 5) << 0x23 | 0x7ffffffffU)
                ;
                if ((long)uVar15 < 0) {
                  uVar18 = uVar18 & ((long)(char)(byte)local_88[3] << 0x2a | 0x3ffffffffffU);
                  if ((long)uVar18 < 0) {
                    uVar15 = uVar15 & ((long)(char)*(byte *)((long)local_88 + 7) << 0x31 |
                                      0x1ffffffffffffU);
                    if ((long)uVar15 < 0) {
                      uVar18 = uVar18 & ((ulong)(byte)local_88[4] << 0x38 | 0xffffffffffffff);
                      if ((long)uVar18 < 0) {
                        puVar14 = local_88 + 5;
                        if (*(byte *)((long)local_88 + 9) != 1) {
                          if ((char)*(byte *)((long)local_88 + 9) < '\0') {
                            puVar14 = (ushort *)0x0;
                            goto LAB_0044d4f2;
                          }
                          if ((*(byte *)((long)local_88 + 9) & 1) == 0) {
                            uVar18 = uVar18 ^ 0x8000000000000000;
                          }
                        }
                      }
                      else {
                        puVar14 = (ushort *)((long)local_88 + 9);
                      }
                    }
                    else {
                      puVar14 = local_88 + 4;
                    }
                  }
                  else {
                    puVar14 = (ushort *)((long)local_88 + 7);
                  }
                }
                else {
                  puVar14 = local_88 + 3;
                }
              }
              else {
                puVar14 = (ushort *)((long)local_88 + 5);
              }
            }
            else {
              puVar14 = local_88 + 2;
            }
          }
          else {
            puVar14 = (ushort *)((long)local_88 + 3);
          }
          uVar15 = uVar15 & uVar18;
        }
        else {
          puVar14 = local_88 + 1;
        }
        pcVar19 = (pointer)((ulong)pcVar19 & uVar15);
      }
      else {
        puVar14 = (ushort *)((long)local_88 + 1);
      }
LAB_0044d4f2:
      local_88 = puVar14;
      if (puVar14 == (ushort *)0x0) goto LAB_0044d90c;
      uVar22 = (uint)pcVar19;
      if ((char)uVar12 == '\x02') {
        bVar10 = MapTypeCard::is_zigzag(&local_8a);
        pcVar17 = (pointer)(-(ulong)(uVar22 & 1) ^ (ulong)pcVar19 >> 1);
        if (!bVar10) {
          pcVar17 = pcVar19;
        }
        (s->_M_dataplus)._M_p = pcVar17;
LAB_0044d5fd:
        iVar20 = 2;
        goto LAB_0044d814;
      }
      if ((int)uVar12 == 1) {
        bVar10 = MapTypeCard::is_zigzag(&local_8a);
        uVar16 = -(uVar22 & 1) ^ (uint)((ulong)pcVar19 >> 1) & 0x7fffffff;
        if (!bVar10) {
          uVar16 = uVar22;
        }
        *(uint *)&(s->_M_dataplus)._M_p = uVar16;
        goto LAB_0044d5fd;
      }
      if (uVar12 == 0) {
        *(bool *)&(s->_M_dataplus)._M_p = pcVar19 != (pointer)0x0;
        goto LAB_0044d5fd;
      }
      goto LAB_0044daa4;
    case 1:
      pcVar19 = *(pointer *)local_88;
      local_88 = local_88 + 4;
      (s->_M_dataplus)._M_p = pcVar19;
      break;
    case 2:
      if ((char)uVar12 == '\x05') {
        bVar2 = (byte)*local_88;
        auVar9[8] = bVar2;
        auVar9._0_8_ = uVar12;
        auVar9._9_3_ = 0;
        if ((char)bVar2 < '\0') {
          pVar23 = ReadSizeFallback((char *)local_88,(uint)bVar2);
          auVar9 = pVar23._0_12_;
          local_88 = (ushort *)pVar23.first;
        }
        else {
          local_88 = (ushort *)((long)local_88 + 1);
        }
        iVar20 = 1;
        if ((local_88 != (ushort *)0x0) &&
           (local_88 = (ushort *)
                       EpsCopyInputStream::ReadString
                                 (&ctx->super_EpsCopyInputStream,(char *)local_88,auVar9._8_4_,s),
           local_88 != (ushort *)0x0)) {
          bVar10 = MapTypeCard::is_utf8(&local_8a);
          if ((bVar10) &&
             ((local_7d != 0 &&
              (iVar11 = utf8_range_IsValid((s->_M_dataplus)._M_p,s->_M_string_length), iVar11 == 0))
             )) {
            pcVar1 = (char *)((long)&table->has_bits_offset +
                             (ulong)table->num_aux_entries * 8 + (ulong)table->aux_offset);
            uVar6 = table->num_field_entries;
            cVar3 = *pcVar1;
            sVar24 = FieldName(table,entry);
            message_name._M_str = (char *)sVar24._M_len;
            message_name._M_len = (size_t)(pcVar1 + (uVar6 + 8 & 0xfffffff8));
            field_name._M_str = "parsing";
            field_name._M_len = (size_t)sVar24._M_str;
            PrintUTF8ErrorLog((internal *)(long)cVar3,message_name,field_name,(char *)0x0,
                              (bool)in_stack_ffffffffffffff68);
            if ((local_7e & 4) != 0) goto LAB_0044d814;
          }
          break;
        }
        goto LAB_0044d814;
      }
      if ((int)uVar12 == 6) {
        pcVar13 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (uVar12,6,
                             "static_cast<int>(type_kind) == static_cast<int>(UntypedMapBase::TypeKind::kMessage)"
                            );
      }
      if (pcVar13 != (Nonnull<const_char_*>)0x0) goto LAB_0044da8a;
      if (uVar22 == local_7c) {
        pcVar13 = (Nonnull<const_char_*>)0x0;
      }
      else {
        local_64 = MVar5.tag_;
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_char>
                            ((ulong)uVar22,local_64,"inner_tag == value_tag");
      }
      if (pcVar13 == (Nonnull<const_char_*>)0x0) {
        if ((char)(byte)*local_88 < '\0') {
          pVar23 = ReadSizeFallback((char *)local_88,(uint)(byte)*local_88);
          puVar14 = (ushort *)pVar23.first;
        }
        else {
          puVar14 = (ushort *)((long)local_88 + 1);
        }
        if ((puVar14 == (ushort *)0x0) || (ctx->depth_ < 1)) {
          puVar14 = (ushort *)0x0;
        }
        else {
          EpsCopyInputStream::PushLimit((EpsCopyInputStream *)&local_78,(char *)ctx,(int)puVar14);
          local_60 = (int)local_78;
          ctx->depth_ = ctx->depth_ + -1;
        }
        if (puVar14 != (ushort *)0x0) {
          iVar20 = ctx->depth_;
          p_Var8 = aux[1].verify_func;
          local_78 = puVar14;
          while (bVar10 = EpsCopyInputStream::DoneWithCheck<false>
                                    (&ctx->super_EpsCopyInputStream,(char **)&local_78,
                                     ctx->group_depth_), !bVar10) {
            uVar22 = (uint)(byte)p_Var8[8] & (uint)*local_78;
            if ((uVar22 & 7) != 0) {
              protobuf_assumption_failed
                        ("(idx & 7) == 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                         ,0x452);
            }
            uVar12 = (ulong)(uVar22 & 0xfffffff8);
            local_78 = (ushort *)
                       (**(code **)(p_Var8 + uVar12 * 2 + 0x38))
                                 (s,local_78,ctx,
                                  (ulong)*local_78 ^ *(ulong *)(p_Var8 + uVar12 * 2 + 0x40),p_Var8);
            if ((local_78 == (ushort *)0x0) ||
               ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
          }
          if (((byte)p_Var8[9] & 1) == 0) {
            puVar14 = local_78;
            if (local_78 == (ushort *)0x0) {
              VerifyHasBitConsistency((MessageLite *)entry,in_stack_ffffffffffffff90);
              puVar14 = local_78;
            }
          }
          else {
            puVar14 = (ushort *)(**(code **)(p_Var8 + 0x28))(s,local_78,ctx);
          }
          if (puVar14 != (ushort *)0x0) {
            if (iVar20 == ctx->depth_) {
              pcVar13 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  ((long)iVar20,(long)ctx->depth_,"old_depth == depth_");
            }
            if (pcVar13 != (Nonnull<const_char_*>)0x0) goto LAB_0044daa9;
          }
          ctx->depth_ = ctx->depth_ + 1;
          uVar22 = (ctx->super_EpsCopyInputStream).limit_ + local_60;
          (ctx->super_EpsCopyInputStream).limit_ = uVar22;
          if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
            (ctx->super_EpsCopyInputStream).limit_end_ =
                 (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar22 >> 0x1f & uVar22);
            goto LAB_0044d804;
          }
        }
        puVar14 = (ushort *)0x0;
        goto LAB_0044d804;
      }
      goto LAB_0044da97;
    default:
      ParseOneMapEntry();
LAB_0044da8a:
      ParseOneMapEntry();
LAB_0044da97:
      ParseOneMapEntry();
LAB_0044daa4:
      ParseOneMapEntry();
LAB_0044daa9:
      ParseOneMapEntry();
    case 5:
      uVar7 = *(undefined4 *)local_88;
      local_88 = local_88 + 2;
      *(undefined4 *)&(s->_M_dataplus)._M_p = uVar7;
    }
    iVar20 = 2;
LAB_0044d814:
    if (iVar20 != 2) {
      if (iVar20 != 3) {
        local_88 = (ushort *)0x0;
      }
      return (char *)local_88;
    }
  } while( true );
}

Assistant:

const char* TcParser::ParseOneMapEntry(
    NodeBase* node, const char* ptr, ParseContext* ctx,
    const TcParseTableBase::FieldAux* aux, const TcParseTableBase* table,
    const TcParseTableBase::FieldEntry& entry, UntypedMapBase& map) {
  using WFL = WireFormatLite;

  const auto map_info = aux[0].map_info;
  const uint8_t key_tag = map_info.key_type_card.tag();
  const uint8_t value_tag = map_info.value_type_card.tag();

  while (!ctx->Done(&ptr)) {
    uint32_t inner_tag = ptr[0];

    if (ABSL_PREDICT_FALSE(inner_tag != key_tag && inner_tag != value_tag)) {
      // Do a full parse and check again in case the tag has non-canonical
      // encoding.
      ptr = ReadTag(ptr, &inner_tag);
      if (ABSL_PREDICT_FALSE(inner_tag != key_tag && inner_tag != value_tag)) {
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;

        if (inner_tag == 0 || (inner_tag & 7) == WFL::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(inner_tag);
          break;
        }

        ptr = UnknownFieldParse(inner_tag, nullptr, ptr, ctx);
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        continue;
      }
    } else {
      ++ptr;
    }

    MapTypeCard type_card;
    UntypedMapBase::TypeKind type_kind;
    void* obj;
    if (inner_tag == key_tag) {
      type_card = map_info.key_type_card;
      type_kind = map.type_info().key_type_kind();
      obj = node->GetVoidKey();
    } else {
      type_card = map_info.value_type_card;
      type_kind = map.type_info().value_type_kind();
      obj = map.GetVoidValue(node);
    }

    switch (inner_tag & 7) {
      case WFL::WIRETYPE_VARINT:
        uint64_t tmp;
        ptr = ParseVarint(ptr, &tmp);
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        switch (type_kind) {
          case UntypedMapBase::TypeKind::kBool:
            *reinterpret_cast<bool*>(obj) = static_cast<bool>(tmp);
            continue;
          case UntypedMapBase::TypeKind::kU32: {
            uint32_t v = static_cast<uint32_t>(tmp);
            if (type_card.is_zigzag()) v = WFL::ZigZagDecode32(v);
            memcpy(obj, &v, sizeof(v));
            continue;
          }
          case UntypedMapBase::TypeKind::kU64:
            if (type_card.is_zigzag()) tmp = WFL::ZigZagDecode64(tmp);
            memcpy(obj, &tmp, sizeof(tmp));
            continue;
          default:
            Unreachable();
        }
      case WFL::WIRETYPE_FIXED32:
        ptr = ReadFixed<uint32_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_FIXED64:
        ptr = ReadFixed<uint64_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_LENGTH_DELIMITED:
        if (type_kind == UntypedMapBase::TypeKind::kString) {
          const int size = ReadSize(&ptr);
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          std::string* str = reinterpret_cast<std::string*>(obj);
          ptr = ctx->ReadString(ptr, size, str);
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          bool do_utf8_check = map_info.fail_on_utf8_failure;
#ifndef NDEBUG
          do_utf8_check |= map_info.log_debug_utf8_failure;
#endif
          if (type_card.is_utf8() && do_utf8_check &&
              !utf8_range::IsStructurallyValid(*str)) {
            PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry),
                              "parsing", false);
            if (map_info.fail_on_utf8_failure) {
              return nullptr;
            }
          }
          continue;
        } else {
          ABSL_DCHECK_EQ(static_cast<int>(type_kind),
                         static_cast<int>(UntypedMapBase::TypeKind::kMessage));
          ABSL_DCHECK_EQ(inner_tag, value_tag);
          ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
            return ParseLoop(reinterpret_cast<MessageLite*>(obj), ptr, ctx,
                             aux[1].table);
          });
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          continue;
        }
      default:
        Unreachable();
    }
  }
  return ptr;
}